

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

void __thiscall SAT::learntLenBumpActivity(SAT *this,int l)

{
  rep rVar1;
  double *pdVar2;
  uint in_ESI;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  double dVar3;
  int i;
  double factor;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> diff;
  time_point new_ll_time;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffa8;
  duration in_stack_ffffffffffffffb0;
  uint local_3c;
  
  if ((int)in_ESI < 0x200) {
    if (engine.conflicts % 0x10 == 0) {
      rVar1 = std::chrono::_V2::steady_clock::now();
      std::chrono::operator-
                (in_RDI,(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)in_stack_ffffffffffffffb0.__r);
      std::chrono::
      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                (in_stack_ffffffffffffffa8);
      dVar3 = to_sec(in_stack_ffffffffffffffb0);
      dVar3 = exp(dVar3 / (double)in_RDI[0x4c].__d.__r);
      in_RDI[0x4b].__d.__r = (rep)(dVar3 * (double)in_RDI[0x4b].__d.__r);
      if (1e+100 < (double)in_RDI[0x4b].__d.__r) {
        for (local_3c = 0; (int)local_3c < 0x200; local_3c = local_3c + 1) {
          pdVar2 = vec<double>::operator[]((vec<double> *)(in_RDI + 0x4d),local_3c);
          *pdVar2 = *pdVar2 * 1e-100;
        }
        in_RDI[0x4b].__d.__r = (rep)((double)in_RDI[0x4b].__d.__r * 1e-100);
      }
      in_RDI[0x4a].__d.__r = rVar1;
      in_RDI[0x49].__d.__r = (rep)((double)in_RDI[0x49].__d.__r / dVar3);
    }
    dVar3 = (double)in_RDI[0x4b].__d.__r;
    pdVar2 = vec<double>::operator[]((vec<double> *)(in_RDI + 0x4d),in_ESI);
    *pdVar2 = dVar3 + *pdVar2;
    in_RDI[0x49].__d.__r = (rep)(1.0 / (double)in_RDI[0x4c].__d.__r + (double)in_RDI[0x49].__d.__r);
  }
  return;
}

Assistant:

inline void SAT::learntLenBumpActivity(int l) {
	if (l >= MAX_SHARE_LEN) {
		return;
	}
	if (engine.conflicts % 16 == 0) {
		const time_point new_ll_time = chuffed_clock::now();
		auto diff = std::chrono::duration_cast<duration>(new_ll_time - ll_time);
		const double factor = exp(to_sec(diff) / learnt_len_el);
		ll_inc *= factor;
		if (ll_inc > 1e100) {
			for (int i = 0; i < MAX_SHARE_LEN; i++) {
				learnt_len_occ[i] *= 1e-100;
			}
			ll_inc *= 1e-100;
		}
		ll_time = new_ll_time;
		confl_rate /= factor;
	}
	learnt_len_occ[l] += ll_inc;
	confl_rate += 1 / learnt_len_el;
}